

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddExtension<google::protobuf::FieldDescriptorProto>
          (DescriptorIndex *this,StringPiece filename,FieldDescriptorProto *field)

{
  String *__return_storage_ptr__;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  __first;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  __last;
  bool bVar1;
  LogMessage *pLVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  pair<std::_Rb_tree_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_bool>
  pVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  StringPiece filename_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_a0;
  undefined1 local_78 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  StringPiece local_40;
  
  filename_local.length_ = filename.length_;
  filename_local.ptr_ = filename.ptr_;
  str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ((ulong)(field->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  bVar1 = true;
  if ((str->_M_string_length != 0) && (*(str->_M_dataplus)._M_p == '.')) {
    local_78._0_4_ =
         (int)(((long)(this->all_values_).
                      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->all_values_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) - LOGLEVEL_WARNING;
    __return_storage_ptr__ = (String *)(local_78 + 8);
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_40,str);
    EncodeString_abi_cxx11_(__return_storage_ptr__,this,local_40);
    local_50._M_allocated_capacity._0_4_ = field->number_;
    pVar3 = std::
            _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>
            ::
            _M_insert_unique<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_const&>
                      ((_Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>
                        *)&this->by_extension_,(ExtensionEntry *)local_78);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    else {
      __first._M_current =
           (this->by_extension_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->by_extension_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::substr
                ((ulong)&local_d0,(ulong)(field->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_a0.first._M_string_length = local_c8;
      local_a0.second = field->number_;
      local_a0.first._M_dataplus._M_p = (pointer)&local_a0.first.field_2;
      if (local_d0 == &local_c0) {
        local_a0.first.field_2._8_8_ = local_c0._8_8_;
      }
      else {
        local_a0.first._M_dataplus._M_p = (pointer)local_d0;
      }
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      local_d0 = &local_c0;
      bVar1 = std::
              binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::pair<std::__cxx11::string,int>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                        (__first,__last,&local_a0,
                         (this->by_extension_)._M_t._M_impl.
                         super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                         ._M_key_compare.index);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      if (!bVar1) {
        return true;
      }
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x2f4);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_78,
                        "Extension conflicts with extension already in database: extend ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,(string *)
                               ((ulong)(field->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    pLVar2 = internal::LogMessage::operator<<(pLVar2," { ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,(string *)
                               ((ulong)(field->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    pLVar2 = internal::LogMessage::operator<<(pLVar2," = ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,field->number_);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," } from:");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&filename_local);
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddExtension(
    StringPiece filename, const FieldProto& field) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!InsertIfNotPresent(
            &by_extension_,
            ExtensionEntry{static_cast<int>(all_values_.size() - 1),
                           EncodeString(field.extendee()), field.number()}) ||
        std::binary_search(
            by_extension_flat_.begin(), by_extension_flat_.end(),
            std::make_pair(field.extendee().substr(1), field.number()),
            by_extension_.key_comp())) {
      GOOGLE_LOG(ERROR) << "Extension conflicts with extension already in database: "
                    "extend "
                 << field.extendee() << " { " << field.name() << " = "
                 << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}